

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSelector.cpp
# Opt level: O0

void __thiscall cali::RecordSelector::RecordSelector(RecordSelector *this,QuerySpec *spec)

{
  RecordSelectorImpl *this_00;
  element_type *this_01;
  QuerySpec *spec_local;
  RecordSelector *this_local;
  
  this_00 = (RecordSelectorImpl *)operator_new(0x18);
  RecordSelectorImpl::RecordSelectorImpl(this_00);
  std::shared_ptr<cali::RecordSelector::RecordSelectorImpl>::
  shared_ptr<cali::RecordSelector::RecordSelectorImpl,void>(&this->mP,this_00);
  this_01 = std::
            __shared_ptr_access<cali::RecordSelector::RecordSelectorImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<cali::RecordSelector::RecordSelectorImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  RecordSelectorImpl::configure(this_01,spec);
  return;
}

Assistant:

RecordSelector::RecordSelector(const QuerySpec& spec) : mP { new RecordSelectorImpl }
{
    mP->configure(spec);
}